

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O2

T_INDEX __thiscall
Nova::Grid<float,_1>::Cell(Grid<float,_1> *this,TV *location,int number_of_ghost_cells)

{
  int in_ECX;
  undefined4 in_register_00000014;
  
  (this->counts)._data._M_elems[0] = 0;
  Cell((Grid<float,_1> *)location,(TV *)CONCAT44(in_register_00000014,number_of_ghost_cells),
       &this->counts,in_ECX);
  return (T_INDEX)SUB84(this,0);
}

Assistant:

T_INDEX Cell(const TV& location,const int number_of_ghost_cells) const
    {
        T_INDEX index;
        Cell(location,index,number_of_ghost_cells);
        return index;
    }